

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

int __thiscall Parser::access(Parser *this,char *__name,int __type)

{
  undefined4 in_register_00000014;
  ptr<Expression> accessValue;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_58;
  shared_ptr<Expression> local_48;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  consume((Parser *)__name);
  expression((Parser *)&accessValue);
  consume((Parser *)__name,RightBrack,"\']\'");
  std::make_shared<ElementAccess,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
            (&local_48,(shared_ptr<Expression> *)CONCAT44(in_register_00000014,__type));
  local_38._M_ptr = local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38._M_refcount._M_pi =
       local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_58,&local_38);
  postfix(this,(ptr<Expression> *)__name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&accessValue.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return (int)this;
}

Assistant:

ptr<Expression> Parser::access(ptr<Expression> callee) {
    consume();
    ptr<Expression> accessValue = expression();
    consume(TokenType::RightBrack, "']'");
    ptr<Expression> expr = make<ElementAccess>(callee, accessValue);
    return postfix(expr);
}